

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O2

void __thiscall
ring_buffer_base<cubeb_log_message>::ring_buffer_base
          (ring_buffer_base<cubeb_log_message> *this,int capacity)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  pointer __p;
  ulong uVar29;
  pointer pcVar30;
  long lVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar53;
  int iVar56;
  int iVar57;
  undefined1 auVar54 [16];
  int iVar58;
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar72;
  int iVar76;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  
  iVar53 = capacity + 1;
  this->capacity_ = iVar53;
  (this->data_)._M_t.
  super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>._M_t.
  super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>.
  super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl = (cubeb_log_message *)0x0;
  uVar29 = 0xffffffffffffffff;
  if (-2 < capacity) {
    uVar29 = (long)iVar53 << 8;
  }
  __p = (pointer)operator_new__(uVar29);
  auVar28 = _DAT_001377d0;
  auVar27 = _DAT_001377c0;
  auVar26 = _DAT_001377b0;
  auVar25 = _DAT_001377a0;
  auVar24 = _DAT_00137790;
  auVar23 = _DAT_00137780;
  auVar22 = _DAT_00137770;
  if (capacity != -1) {
    uVar32 = (long)iVar53 + 0xffffffffffffff;
    uVar29 = uVar32 & 0xffffffffffffff;
    auVar33._8_4_ = (int)uVar29;
    auVar33._0_8_ = uVar29;
    auVar33._12_4_ = (int)(uVar29 >> 0x20);
    pcVar30 = __p + 0xf;
    lVar31 = 0;
    do {
      auVar51._8_4_ = (int)lVar31;
      auVar51._0_8_ = lVar31;
      auVar51._12_4_ = (int)((ulong)lVar31 >> 0x20);
      auVar54 = auVar33 ^ auVar28;
      auVar59 = (auVar51 | auVar27) ^ auVar28;
      iVar53 = auVar54._0_4_;
      iVar72 = -(uint)(iVar53 < auVar59._0_4_);
      iVar56 = auVar54._4_4_;
      auVar61._4_4_ = -(uint)(iVar56 < auVar59._4_4_);
      iVar57 = auVar54._8_4_;
      iVar76 = -(uint)(iVar57 < auVar59._8_4_);
      iVar58 = auVar54._12_4_;
      auVar61._12_4_ = -(uint)(iVar58 < auVar59._12_4_);
      auVar34._4_4_ = iVar72;
      auVar34._0_4_ = iVar72;
      auVar34._8_4_ = iVar76;
      auVar34._12_4_ = iVar76;
      auVar34 = pshuflw(in_XMM1,auVar34,0xe8);
      auVar60._4_4_ = -(uint)(auVar59._4_4_ == iVar56);
      auVar60._12_4_ = -(uint)(auVar59._12_4_ == iVar58);
      auVar60._0_4_ = auVar60._4_4_;
      auVar60._8_4_ = auVar60._12_4_;
      auVar43 = pshuflw(in_XMM2,auVar60,0xe8);
      auVar61._0_4_ = auVar61._4_4_;
      auVar61._8_4_ = auVar61._12_4_;
      auVar59 = pshuflw(auVar34,auVar61,0xe8);
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      auVar54 = (auVar59 | auVar43 & auVar34) ^ auVar54;
      auVar54 = packssdw(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar30[-0xf].storage[0] = '\0';
      }
      auVar43._4_4_ = iVar72;
      auVar43._0_4_ = iVar72;
      auVar43._8_4_ = iVar76;
      auVar43._12_4_ = iVar76;
      auVar61 = auVar60 & auVar43 | auVar61;
      auVar54 = packssdw(auVar61,auVar61);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar59,auVar54 ^ auVar59);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._0_4_ >> 8 & 1) != 0) {
        pcVar30[-0xe].storage[0] = '\0';
      }
      auVar54 = (auVar51 | auVar26) ^ auVar28;
      auVar44._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar44._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar44._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar44._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar62._4_4_ = auVar44._0_4_;
      auVar62._0_4_ = auVar44._0_4_;
      auVar62._8_4_ = auVar44._8_4_;
      auVar62._12_4_ = auVar44._8_4_;
      iVar72 = -(uint)(auVar54._4_4_ == iVar56);
      iVar76 = -(uint)(auVar54._12_4_ == iVar58);
      auVar10._4_4_ = iVar72;
      auVar10._0_4_ = iVar72;
      auVar10._8_4_ = iVar76;
      auVar10._12_4_ = iVar76;
      auVar73._4_4_ = auVar44._4_4_;
      auVar73._0_4_ = auVar44._4_4_;
      auVar73._8_4_ = auVar44._12_4_;
      auVar73._12_4_ = auVar44._12_4_;
      auVar54 = auVar10 & auVar62 | auVar73;
      auVar54 = packssdw(auVar54,auVar54);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar1,auVar54 ^ auVar1);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._0_4_ >> 0x10 & 1) != 0) {
        pcVar30[-0xd].storage[0] = '\0';
      }
      auVar54 = pshufhw(auVar54,auVar62,0x84);
      auVar11._4_4_ = iVar72;
      auVar11._0_4_ = iVar72;
      auVar11._8_4_ = iVar76;
      auVar11._12_4_ = iVar76;
      auVar59 = pshufhw(auVar44,auVar11,0x84);
      auVar34 = pshufhw(auVar54,auVar73,0x84);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar35 = (auVar34 | auVar59 & auVar54) ^ auVar35;
      auVar54 = packssdw(auVar35,auVar35);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._0_4_ >> 0x18 & 1) != 0) {
        pcVar30[-0xc].storage[0] = '\0';
      }
      auVar54 = (auVar51 | auVar25) ^ auVar28;
      auVar45._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar45._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar45._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar45._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar12._4_4_ = auVar45._0_4_;
      auVar12._0_4_ = auVar45._0_4_;
      auVar12._8_4_ = auVar45._8_4_;
      auVar12._12_4_ = auVar45._8_4_;
      auVar59 = pshuflw(auVar73,auVar12,0xe8);
      auVar36._0_4_ = -(uint)(auVar54._0_4_ == iVar53);
      auVar36._4_4_ = -(uint)(auVar54._4_4_ == iVar56);
      auVar36._8_4_ = -(uint)(auVar54._8_4_ == iVar57);
      auVar36._12_4_ = -(uint)(auVar54._12_4_ == iVar58);
      auVar63._4_4_ = auVar36._4_4_;
      auVar63._0_4_ = auVar36._4_4_;
      auVar63._8_4_ = auVar36._12_4_;
      auVar63._12_4_ = auVar36._12_4_;
      auVar54 = pshuflw(auVar36,auVar63,0xe8);
      auVar64._4_4_ = auVar45._4_4_;
      auVar64._0_4_ = auVar45._4_4_;
      auVar64._8_4_ = auVar45._12_4_;
      auVar64._12_4_ = auVar45._12_4_;
      auVar34 = pshuflw(auVar45,auVar64,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 & auVar59,(auVar34 | auVar54 & auVar59) ^ auVar2);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar30[-0xb].storage[0] = '\0';
      }
      auVar13._4_4_ = auVar45._0_4_;
      auVar13._0_4_ = auVar45._0_4_;
      auVar13._8_4_ = auVar45._8_4_;
      auVar13._12_4_ = auVar45._8_4_;
      auVar64 = auVar63 & auVar13 | auVar64;
      auVar34 = packssdw(auVar64,auVar64);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54,auVar34 ^ auVar3);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._4_2_ >> 8 & 1) != 0) {
        pcVar30[-10].storage[0] = '\0';
      }
      auVar54 = (auVar51 | auVar24) ^ auVar28;
      auVar46._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar46._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar46._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar46._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar65._4_4_ = auVar46._0_4_;
      auVar65._0_4_ = auVar46._0_4_;
      auVar65._8_4_ = auVar46._8_4_;
      auVar65._12_4_ = auVar46._8_4_;
      iVar72 = -(uint)(auVar54._4_4_ == iVar56);
      iVar76 = -(uint)(auVar54._12_4_ == iVar58);
      auVar14._4_4_ = iVar72;
      auVar14._0_4_ = iVar72;
      auVar14._8_4_ = iVar76;
      auVar14._12_4_ = iVar76;
      auVar74._4_4_ = auVar46._4_4_;
      auVar74._0_4_ = auVar46._4_4_;
      auVar74._8_4_ = auVar46._12_4_;
      auVar74._12_4_ = auVar46._12_4_;
      auVar54 = auVar14 & auVar65 | auVar74;
      auVar54 = packssdw(auVar54,auVar54);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar4,auVar54 ^ auVar4);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar30[-9].storage[0] = '\0';
      }
      auVar54 = pshufhw(auVar54,auVar65,0x84);
      auVar15._4_4_ = iVar72;
      auVar15._0_4_ = iVar72;
      auVar15._8_4_ = iVar76;
      auVar15._12_4_ = iVar76;
      auVar59 = pshufhw(auVar46,auVar15,0x84);
      auVar34 = pshufhw(auVar54,auVar74,0x84);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar37 = (auVar34 | auVar59 & auVar54) ^ auVar37;
      auVar54 = packssdw(auVar37,auVar37);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._6_2_ >> 8 & 1) != 0) {
        pcVar30[-8].storage[0] = '\0';
      }
      auVar54 = (auVar51 | auVar23) ^ auVar28;
      auVar47._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar47._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar47._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar47._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar16._4_4_ = auVar47._0_4_;
      auVar16._0_4_ = auVar47._0_4_;
      auVar16._8_4_ = auVar47._8_4_;
      auVar16._12_4_ = auVar47._8_4_;
      auVar59 = pshuflw(auVar74,auVar16,0xe8);
      auVar38._0_4_ = -(uint)(auVar54._0_4_ == iVar53);
      auVar38._4_4_ = -(uint)(auVar54._4_4_ == iVar56);
      auVar38._8_4_ = -(uint)(auVar54._8_4_ == iVar57);
      auVar38._12_4_ = -(uint)(auVar54._12_4_ == iVar58);
      auVar66._4_4_ = auVar38._4_4_;
      auVar66._0_4_ = auVar38._4_4_;
      auVar66._8_4_ = auVar38._12_4_;
      auVar66._12_4_ = auVar38._12_4_;
      auVar54 = pshuflw(auVar38,auVar66,0xe8);
      auVar67._4_4_ = auVar47._4_4_;
      auVar67._0_4_ = auVar47._4_4_;
      auVar67._8_4_ = auVar47._12_4_;
      auVar67._12_4_ = auVar47._12_4_;
      auVar34 = pshuflw(auVar47,auVar67,0xe8);
      auVar48._8_4_ = 0xffffffff;
      auVar48._0_8_ = 0xffffffffffffffff;
      auVar48._12_4_ = 0xffffffff;
      auVar48 = (auVar34 | auVar54 & auVar59) ^ auVar48;
      auVar34 = packssdw(auVar48,auVar48);
      auVar54 = packsswb(auVar54 & auVar59,auVar34);
      if ((auVar54 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar30[-7].storage[0] = '\0';
      }
      auVar17._4_4_ = auVar47._0_4_;
      auVar17._0_4_ = auVar47._0_4_;
      auVar17._8_4_ = auVar47._8_4_;
      auVar17._12_4_ = auVar47._8_4_;
      auVar67 = auVar66 & auVar17 | auVar67;
      auVar34 = packssdw(auVar67,auVar67);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar5,auVar34 ^ auVar5);
      auVar54 = packsswb(auVar54,auVar34);
      if ((auVar54._8_2_ >> 8 & 1) != 0) {
        pcVar30[-6].storage[0] = '\0';
      }
      auVar54 = (auVar51 | auVar22) ^ auVar28;
      auVar49._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar49._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar49._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar49._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar68._4_4_ = auVar49._0_4_;
      auVar68._0_4_ = auVar49._0_4_;
      auVar68._8_4_ = auVar49._8_4_;
      auVar68._12_4_ = auVar49._8_4_;
      iVar72 = -(uint)(auVar54._4_4_ == iVar56);
      iVar76 = -(uint)(auVar54._12_4_ == iVar58);
      auVar18._4_4_ = iVar72;
      auVar18._0_4_ = iVar72;
      auVar18._8_4_ = iVar76;
      auVar18._12_4_ = iVar76;
      auVar75._4_4_ = auVar49._4_4_;
      auVar75._0_4_ = auVar49._4_4_;
      auVar75._8_4_ = auVar49._12_4_;
      auVar75._12_4_ = auVar49._12_4_;
      auVar54 = auVar18 & auVar68 | auVar75;
      auVar54 = packssdw(auVar54,auVar54);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar6,auVar54 ^ auVar6);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pcVar30[-5].storage[0] = '\0';
      }
      auVar54 = pshufhw(auVar54,auVar68,0x84);
      auVar19._4_4_ = iVar72;
      auVar19._0_4_ = iVar72;
      auVar19._8_4_ = iVar76;
      auVar19._12_4_ = iVar76;
      auVar59 = pshufhw(auVar49,auVar19,0x84);
      auVar34 = pshufhw(auVar54,auVar75,0x84);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar34 | auVar59 & auVar54) ^ auVar39;
      auVar54 = packssdw(auVar39,auVar39);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._10_2_ >> 8 & 1) != 0) {
        pcVar30[-4].storage[0] = '\0';
      }
      auVar54 = (auVar51 | _DAT_00137760) ^ auVar28;
      auVar50._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar50._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar50._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar50._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar20._4_4_ = auVar50._0_4_;
      auVar20._0_4_ = auVar50._0_4_;
      auVar20._8_4_ = auVar50._8_4_;
      auVar20._12_4_ = auVar50._8_4_;
      auVar59 = pshuflw(auVar75,auVar20,0xe8);
      auVar40._0_4_ = -(uint)(auVar54._0_4_ == iVar53);
      auVar40._4_4_ = -(uint)(auVar54._4_4_ == iVar56);
      auVar40._8_4_ = -(uint)(auVar54._8_4_ == iVar57);
      auVar40._12_4_ = -(uint)(auVar54._12_4_ == iVar58);
      auVar69._4_4_ = auVar40._4_4_;
      auVar69._0_4_ = auVar40._4_4_;
      auVar69._8_4_ = auVar40._12_4_;
      auVar69._12_4_ = auVar40._12_4_;
      auVar54 = pshuflw(auVar40,auVar69,0xe8);
      auVar70._4_4_ = auVar50._4_4_;
      auVar70._0_4_ = auVar50._4_4_;
      auVar70._8_4_ = auVar50._12_4_;
      auVar70._12_4_ = auVar50._12_4_;
      auVar34 = pshuflw(auVar50,auVar70,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 & auVar59,(auVar34 | auVar54 & auVar59) ^ auVar7);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar30[-3].storage[0] = '\0';
      }
      auVar21._4_4_ = auVar50._0_4_;
      auVar21._0_4_ = auVar50._0_4_;
      auVar21._8_4_ = auVar50._8_4_;
      auVar21._12_4_ = auVar50._8_4_;
      auVar70 = auVar69 & auVar21 | auVar70;
      auVar34 = packssdw(auVar70,auVar70);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54,auVar34 ^ auVar8);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54._12_2_ >> 8 & 1) != 0) {
        pcVar30[-2].storage[0] = '\0';
      }
      auVar54 = (auVar51 | _DAT_00137750) ^ auVar28;
      auVar41._0_4_ = -(uint)(iVar53 < auVar54._0_4_);
      auVar41._4_4_ = -(uint)(iVar56 < auVar54._4_4_);
      auVar41._8_4_ = -(uint)(iVar57 < auVar54._8_4_);
      auVar41._12_4_ = -(uint)(iVar58 < auVar54._12_4_);
      auVar71._4_4_ = auVar41._0_4_;
      auVar71._0_4_ = auVar41._0_4_;
      auVar71._8_4_ = auVar41._8_4_;
      auVar71._12_4_ = auVar41._8_4_;
      auVar52._4_4_ = -(uint)(auVar54._4_4_ == iVar56);
      auVar52._12_4_ = -(uint)(auVar54._12_4_ == iVar58);
      auVar52._0_4_ = auVar52._4_4_;
      auVar52._8_4_ = auVar52._12_4_;
      auVar55._4_4_ = auVar41._4_4_;
      auVar55._0_4_ = auVar41._4_4_;
      auVar55._8_4_ = auVar41._12_4_;
      auVar55._12_4_ = auVar41._12_4_;
      auVar34 = auVar52 & auVar71 | auVar55;
      auVar54 = packssdw(auVar41,auVar34);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar54 = packssdw(auVar54 ^ auVar9,auVar54 ^ auVar9);
      auVar54 = packsswb(auVar54,auVar54);
      if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar30[-1].storage[0] = '\0';
      }
      auVar54 = pshufhw(auVar54,auVar71,0x84);
      in_XMM2 = pshufhw(auVar34,auVar52,0x84);
      in_XMM2 = in_XMM2 & auVar54;
      auVar54 = pshufhw(auVar54,auVar55,0x84);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar54 | in_XMM2) ^ auVar42;
      auVar54 = packssdw(auVar42,auVar42);
      in_XMM1 = packsswb(auVar54,auVar54);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        pcVar30->storage[0] = '\0';
      }
      lVar31 = lVar31 + 0x10;
      pcVar30 = pcVar30 + 0x10;
    } while ((uVar29 - ((uint)uVar32 & 0xf)) + 0x10 != lVar31);
  }
  std::__uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>::reset
            ((__uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_> *)
             &this->data_,__p);
  LOCK();
  (this->write_index_).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->read_index_).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

ring_buffer_base(int capacity)
    /* One more element to distinguish from empty and full buffer. */
    : capacity_(capacity + 1)
  {
    assert(storage_capacity() <
           std::numeric_limits<int>::max() / 2 &&
           "buffer too large for the type of index used.");
    assert(capacity_ > 0);

    data_.reset(new T[storage_capacity()]);
    /* If this queue is using atomics, initializing those members as the last
     * action in the constructor acts as a full barrier, and allow capacity() to
     * be thread-safe. */
    write_index_ = 0;
    read_index_ = 0;
  }